

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadTime(ON_BinaryArchive *this,tm *utc)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ReadInt32(this,1,&utc->tm_sec);
  if (bVar1) {
    bVar1 = ReadInt32(this,1,&utc->tm_min);
  }
  if (bVar1 != false) {
    bVar1 = ReadInt32(this,1,&utc->tm_hour);
  }
  if (bVar1 != false) {
    bVar1 = ReadInt32(this,1,&utc->tm_mday);
  }
  if (bVar1 != false) {
    bVar1 = ReadInt32(this,1,&utc->tm_mon);
  }
  if (bVar1 != false) {
    bVar1 = ReadInt32(this,1,&utc->tm_year);
  }
  if (bVar1 != false) {
    bVar1 = ReadInt32(this,1,&utc->tm_wday);
  }
  if (bVar1 != false) {
    bVar1 = ReadInt32(this,1,&utc->tm_yday);
  }
  if (bVar1 != false) {
    bVar2 = false;
    if (0x3c < (uint)utc->tm_sec) {
      bVar1 = false;
    }
    if (0x3c < (uint)utc->tm_min) {
      bVar1 = bVar2;
    }
    if (0x18 < (uint)utc->tm_hour) {
      bVar1 = bVar2;
    }
    if (0x1f < (uint)utc->tm_mday) {
      bVar1 = bVar2;
    }
    if (0xc < (uint)utc->tm_mon) {
      bVar1 = bVar2;
    }
    if (7 < (uint)utc->tm_wday) {
      bVar1 = bVar2;
    }
    if (0x16e < (uint)utc->tm_yday) {
      bVar1 = bVar2;
    }
    if (bVar1 == false) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x5db,"","ON_BinaryArchive::ReadTime() - bad time in archive");
    }
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadTime( struct tm& utc )
{
  // utc = coordinated universal time ( a.k.a GMT, UTC )
  // (From ANSI C time() and gmtime().)
  bool rc = ReadInt( &utc.tm_sec );
  if ( rc )
    rc = ReadInt( &utc.tm_min );
  if ( rc )
    rc = ReadInt( &utc.tm_hour );
  if ( rc )
    rc = ReadInt( &utc.tm_mday );
  if ( rc )
    rc = ReadInt( &utc.tm_mon );
  if ( rc )
    rc = ReadInt( &utc.tm_year );
  if ( rc )
    rc = ReadInt( &utc.tm_wday );
  if ( rc )
    rc = ReadInt( &utc.tm_yday );
  if ( rc ) {
    if ( utc.tm_sec < 0 || utc.tm_sec > 60 )
      rc = false;
    if ( utc.tm_min < 0 || utc.tm_min > 60 )
      rc = false;
    if ( utc.tm_hour < 0 || utc.tm_hour > 24 )
      rc = false;
    if ( utc.tm_mday < 0 || utc.tm_mday > 31 )
      rc = false;
    if ( utc.tm_mon < 0 || utc.tm_mon > 12 )
      rc = false;
    // no year restrictions because dates are used in archeological userdata
    if ( utc.tm_wday < 0 || utc.tm_wday > 7 )
      rc = false;
    if ( utc.tm_yday < 0 || utc.tm_yday > 366 )
      rc = false;
    if ( !rc ) {
      ON_ERROR("ON_BinaryArchive::ReadTime() - bad time in archive");
    }
  }
  return rc;
}